

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>
          (Data *this,uint16 op,ByteCodeWriter *writer)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined6 in_register_00000032;
  int iVar5;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22 [6];
  byte byteop;
  byte byteop_1;
  uint16 op_local;
  
  uVar1 = this->currentOffset;
  if ((uint)CONCAT62(in_register_00000032,op) < 0x100) {
    iVar5 = 1;
    Write(this,&local_24,1);
  }
  else {
    Write(this,&local_23,1);
    Write(this,local_22,2);
    iVar5 = (uint)(0xff < op) * 2 + 1;
  }
  if (iVar5 != this->currentOffset - uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd2e,
                                "(OpCodeUtil::EncodedSize((Js::OpCode)op, SmallLayout) == (currentOffset - offset))"
                                ,
                                "OpCodeUtil::EncodedSize((Js::OpCode)op, SmallLayout) == (currentOffset - offset)"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Data::EncodeOpCode<SmallLayout>(
        uint16 op,
        ByteCodeWriter* writer)
    {
        DebugOnly(const uint offset = currentOffset);
        if (op <= (uint16)Js::OpCode::MaxByteSizedOpcodes)
        {
            byte byteop = (byte)op;
            Write(&byteop, sizeof(byte));
        }
        else
        {
            byte byteop = (byte)Js::OpCode::ExtendedOpcodePrefix;
            Write(&byteop, sizeof(byte));
            Write(&op, sizeof(uint16));
        }
        Assert(OpCodeUtil::EncodedSize((Js::OpCode)op, SmallLayout)
               == (currentOffset - offset));
    }